

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall Database::drop_dataset(Database *this,string *dsname)

{
  string_view_t fmt;
  bool bVar1;
  __type_conflict2 _Var2;
  reference ppOVar3;
  vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *in_RDI;
  iterator it;
  OnDiskDataset *in_stack_00000088;
  vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  byte bVar4;
  byte bVar5;
  const_iterator in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_40 [32];
  OnDiskDataset **local_20;
  __normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (OnDiskDataset **)
       std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::begin
                 (in_stack_ffffffffffffff78);
  while( true ) {
    local_20 = (OnDiskDataset **)
               std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::end
                         (in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    ppOVar3 = __gnu_cxx::
              __normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
              ::operator*(local_18);
    OnDiskDataset::get_name_abi_cxx11_(*ppOVar3);
    _Var2 = std::operator==(in_stack_ffffffffffffffa0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff98._M_current);
    bVar4 = 1;
    bVar5 = bVar4;
    if (!_Var2) {
      __gnu_cxx::
      __normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
      ::operator*(local_18);
      OnDiskDataset::get_id_abi_cxx11_(in_stack_00000088);
      bVar4 = std::operator==(in_stack_ffffffffffffffa0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff98._M_current);
      bVar5 = bVar4;
      std::__cxx11::string::~string(local_40);
    }
    if ((bVar4 & 1) == 0) {
      __gnu_cxx::
      __normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
      ::operator++(local_18);
    }
    else {
      in_stack_ffffffffffffff80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &in_RDI[7].super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
      __gnu_cxx::
      __normal_iterator<OnDiskDataset*const*,std::vector<OnDiskDataset*,std::allocator<OnDiskDataset*>>>
      ::__normal_iterator<OnDiskDataset**>
                ((__normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
                  *)in_stack_ffffffffffffff80,
                 (__normal_iterator<OnDiskDataset_**,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
                  *)in_stack_ffffffffffffff78);
      local_18[0]._M_current =
           (OnDiskDataset **)
           std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::erase
                     (in_RDI,in_stack_ffffffffffffff98);
      ::fmt::v6::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_ffffffffffffff80,
                 (char *)in_stack_ffffffffffffff78);
      fmt.data_._6_1_ = bVar4;
      fmt.data_._0_6_ = in_stack_ffffffffffffff88;
      fmt.data_._7_1_ = bVar5;
      fmt.size_ = (size_t)in_RDI;
      spdlog::info<std::__cxx11::string>(fmt,in_stack_ffffffffffffff80);
    }
  }
  return;
}

Assistant:

void Database::drop_dataset(const std::string &dsname) {
    for (auto it = working_datasets.begin(); it != working_datasets.end();) {
        if ((*it)->get_name() == dsname || (*it)->get_id() == dsname) {
            it = working_datasets.erase(it);
            spdlog::info("DROP: {}", dsname);
        } else {
            ++it;
        }
    }
}